

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ImTextureID pvVar4;
  ImDrawCmd *pIVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImDrawCmd *pIVar10;
  int iVar11;
  int iVar12;
  
  fVar6 = (this->_CmdHeader).ClipRect.x;
  fVar7 = (this->_CmdHeader).ClipRect.y;
  fVar8 = (this->_CmdHeader).ClipRect.z;
  fVar9 = (this->_CmdHeader).ClipRect.w;
  pvVar4 = (this->_CmdHeader).TextureId;
  uVar1 = (this->_CmdHeader).VtxOffset;
  uVar2 = (this->IdxBuffer).Size;
  if ((fVar8 < fVar6) || (fVar9 < fVar7)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x1c1,"AddDrawCmd","ImGui ASSERT FAILED: %s",
                "draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
               );
  }
  iVar12 = (this->CmdBuffer).Size;
  iVar3 = (this->CmdBuffer).Capacity;
  if (iVar12 == iVar3) {
    iVar12 = iVar12 + 1;
    if (iVar3 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar3 / 2 + iVar3;
    }
    if (iVar12 < iVar11) {
      iVar12 = iVar11;
    }
    if (iVar3 < iVar12) {
      pIVar10 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x38);
      pIVar5 = (this->CmdBuffer).Data;
      if (pIVar5 != (ImDrawCmd *)0x0) {
        memcpy(pIVar10,pIVar5,(long)(this->CmdBuffer).Size * 0x38);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = pIVar10;
      (this->CmdBuffer).Capacity = iVar12;
    }
  }
  pIVar10 = (this->CmdBuffer).Data;
  iVar12 = (this->CmdBuffer).Size;
  pIVar5 = pIVar10 + iVar12;
  (pIVar5->ClipRect).x = fVar6;
  (pIVar5->ClipRect).y = fVar7;
  (pIVar5->ClipRect).z = fVar8;
  (pIVar5->ClipRect).w = fVar9;
  pIVar10[iVar12].TextureId = pvVar4;
  pIVar10[iVar12].VtxOffset = uVar1;
  pIVar10[iVar12].IdxOffset = uVar2;
  *(undefined8 *)&pIVar10[iVar12].ElemCount = 0;
  *(ImDrawCallback *)(&pIVar10[iVar12].ElemCount + 2) = (ImDrawCallback)0x0;
  pIVar10[iVar12].UserCallbackData = (void *)0x0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}